

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O1

int phr_parse_request(char *buf_start,size_t len,char **method,size_t *method_len,char **path,
                     size_t *path_len,int *minor_version,phr_header *headers,size_t *num_headers,
                     size_t last_len)

{
  byte bVar1;
  size_t max_headers;
  bool bVar2;
  long lVar3;
  int iVar4;
  undefined8 in_RAX;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  int iVar8;
  char *pcVar9;
  int r;
  undefined8 uStack_38;
  
  pcVar6 = buf_start + len;
  max_headers = *num_headers;
  iVar8 = 0;
  *method = (char *)0x0;
  *method_len = 0;
  *path = (char *)0x0;
  *path_len = 0;
  *minor_version = -1;
  *num_headers = 0;
  if (last_len != 0) {
    pcVar5 = buf_start + (last_len - 3);
    if (last_len < 3) {
      pcVar5 = buf_start;
    }
    do {
      if (pcVar5 == pcVar6) {
        return -2;
      }
      pcVar9 = pcVar5 + 1;
      if (*pcVar5 == '\n') {
LAB_00115e9f:
        iVar4 = iVar8 + 1;
      }
      else {
        iVar4 = 0;
        if (*pcVar5 == '\r') {
          if (pcVar9 == pcVar6) {
            return -2;
          }
          if (*pcVar9 != '\n') {
            return -1;
          }
          pcVar9 = pcVar5 + 2;
          goto LAB_00115e9f;
        }
      }
      iVar8 = iVar4;
      pcVar5 = pcVar9;
    } while (iVar8 != 2);
  }
  if (len == 0) {
LAB_00115ecd:
    uStack_38 = 0xfffffffe00000000;
  }
  else {
    if (*buf_start != '\n') {
      pcVar5 = buf_start;
      if (*buf_start != '\r') goto LAB_00115eeb;
      if (len == 1) goto LAB_00115ecd;
      if (buf_start[1] == '\n') {
        pcVar5 = buf_start + 2;
        goto LAB_00115eeb;
      }
      goto LAB_0011604a;
    }
    pcVar5 = buf_start + 1;
LAB_00115eeb:
    uStack_38._0_4_ = (undefined4)in_RAX;
    if (pcVar5 == pcVar6) {
      uStack_38 = CONCAT44(0xfffffffe,(undefined4)uStack_38);
LAB_00115f39:
      bVar2 = false;
    }
    else {
      sVar7 = 0;
      do {
        bVar1 = pcVar5[sVar7];
        if (bVar1 == 0x20) {
          *method = pcVar5;
          *method_len = sVar7;
          pcVar5 = pcVar5 + sVar7;
          bVar2 = true;
          uStack_38 = in_RAX;
          goto LAB_00115f57;
        }
        if ((bVar1 - 0x7f < 0xffffffa1) && ((bVar1 < 0x20 || (bVar1 == 0x7f)))) {
          uStack_38 = CONCAT44(0xffffffff,(undefined4)uStack_38);
          pcVar5 = pcVar5 + sVar7;
          goto LAB_00115f39;
        }
        lVar3 = sVar7 + 1;
        sVar7 = sVar7 + 1;
      } while (pcVar5 + lVar3 != pcVar6);
      uStack_38 = CONCAT44(0xfffffffe,(undefined4)uStack_38);
      bVar2 = false;
      pcVar5 = pcVar6;
    }
LAB_00115f57:
    if (bVar2) {
      do {
        pcVar9 = pcVar5 + 1;
        pcVar5 = pcVar5 + 1;
      } while (*pcVar9 == ' ');
      if (pcVar5 == pcVar6) {
        uStack_38 = CONCAT44(0xfffffffe,(undefined4)uStack_38);
LAB_00115fda:
        bVar2 = false;
      }
      else {
        sVar7 = 0;
        do {
          bVar1 = pcVar5[sVar7];
          if (bVar1 == 0x20) {
            *path = pcVar5;
            *path_len = sVar7;
            pcVar5 = pcVar5 + sVar7;
            bVar2 = true;
            goto LAB_00115ff8;
          }
          if ((bVar1 - 0x7f < 0xffffffa1) && ((bVar1 < 0x20 || (bVar1 == 0x7f)))) {
            uStack_38 = CONCAT44(0xffffffff,(undefined4)uStack_38);
            pcVar5 = pcVar5 + sVar7;
            goto LAB_00115fda;
          }
          lVar3 = sVar7 + 1;
          sVar7 = sVar7 + 1;
        } while (pcVar5 + lVar3 != pcVar6);
        uStack_38 = CONCAT44(0xfffffffe,(undefined4)uStack_38);
        bVar2 = false;
        pcVar5 = pcVar6;
      }
LAB_00115ff8:
      if (bVar2) {
        do {
          pcVar9 = pcVar5 + 1;
          pcVar5 = pcVar5 + 1;
        } while (*pcVar9 == ' ');
        if ((*method_len != 0) && (*path_len != 0)) {
          pcVar5 = parse_http_version(pcVar5,pcVar6,minor_version,(int *)((long)&uStack_38 + 4));
          if (pcVar5 == (char *)0x0) goto LAB_00116052;
          if (*pcVar5 == '\n') {
            pcVar5 = pcVar5 + 1;
LAB_00116073:
            pcVar6 = parse_headers(pcVar5,pcVar6,headers,num_headers,max_headers,
                                   (int *)((long)&uStack_38 + 4));
            goto LAB_00116054;
          }
          if (*pcVar5 == '\r') {
            if (pcVar5 + 1 == pcVar6) goto LAB_00115ecd;
            if (pcVar5[1] == '\n') {
              pcVar5 = pcVar5 + 2;
              goto LAB_00116073;
            }
          }
        }
LAB_0011604a:
        uStack_38 = 0xffffffff00000000;
      }
    }
  }
LAB_00116052:
  pcVar6 = (char *)0x0;
LAB_00116054:
  if (pcVar6 != (char *)0x0) {
    uStack_38._4_4_ = (int)pcVar6 - (int)buf_start;
  }
  return uStack_38._4_4_;
}

Assistant:

int phr_parse_request(const char *buf_start, size_t len, const char **method,
					  size_t *method_len, const char **path, size_t *path_len,
					  int *minor_version, struct phr_header *headers,
					  size_t *num_headers, size_t last_len)
{
	const char *buf = buf_start, *buf_end = buf_start + len;
	size_t max_headers = *num_headers;
	int r;

	*method = NULL;
	*method_len = 0;
	*path = NULL;
	*path_len = 0;
	*minor_version = -1;
	*num_headers = 0;

	/* if last_len != 0, check if the request is complete (a fast countermeasure
	   againt slowloris */
	if (last_len != 0 && is_complete(buf, buf_end, last_len, &r) == NULL) {
		return r;
	}

	if ((buf = parse_request(buf, buf_end, method, method_len, path, path_len,
							 minor_version, headers, num_headers, max_headers,
							 &r)) == NULL) {
		return r;
	}

	return (int)(buf - buf_start);
}